

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_enumerate_devices
              (cubeb_conflict *context,cubeb_device_type type,cubeb_device_collection *collection)

{
  pa_operation *ppVar1;
  undefined8 *in_RDX;
  uint in_ESI;
  long in_RDI;
  pa_operation *o;
  pulse_dev_list_data user_data;
  pa_stream *in_stack_ffffffffffffffc0;
  cubeb_conflict *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  uint local_24;
  
  memset(&stack0xffffffffffffffc0,0,0x28);
  (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)(in_RDI + 0x10));
  ppVar1 = (*cubeb_pa_context_get_server_info)
                     (*(pa_context **)(in_RDI + 0x18),pulse_server_info_cb,&stack0xffffffffffffffc0)
  ;
  if (ppVar1 != (pa_operation *)0x0) {
    operation_wait(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,ppVar1);
    (*cubeb_pa_operation_unref)(ppVar1);
  }
  if (((in_ESI & 2) != 0) &&
     (ppVar1 = (*cubeb_pa_context_get_sink_info_list)
                         (*(pa_context **)(in_RDI + 0x18),pulse_sink_info_cb,
                          &stack0xffffffffffffffc0), ppVar1 != (pa_operation *)0x0)) {
    operation_wait(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,ppVar1);
    (*cubeb_pa_operation_unref)(ppVar1);
  }
  if (((in_ESI & 1) != 0) &&
     (ppVar1 = (*cubeb_pa_context_get_source_info_list)
                         (*(pa_context **)(in_RDI + 0x18),pulse_source_info_cb,
                          &stack0xffffffffffffffc0), ppVar1 != (pa_operation *)0x0)) {
    operation_wait(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,ppVar1);
    (*cubeb_pa_operation_unref)(ppVar1);
  }
  (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)(in_RDI + 0x10));
  *in_RDX = local_30;
  in_RDX[1] = (ulong)local_24;
  free(in_stack_ffffffffffffffc0);
  free(in_stack_ffffffffffffffc8);
  return 0;
}

Assistant:

static int
pulse_enumerate_devices(cubeb * context, cubeb_device_type type,
                        cubeb_device_collection * collection)
{
  pulse_dev_list_data user_data = { NULL, NULL, NULL, 0, 0, context };
  pa_operation * o;

  WRAP(pa_threaded_mainloop_lock)(context->mainloop);

  o = WRAP(pa_context_get_server_info)(context->context,
      pulse_server_info_cb, &user_data);
  if (o) {
    operation_wait(context, NULL, o);
    WRAP(pa_operation_unref)(o);
  }

  if (type & CUBEB_DEVICE_TYPE_OUTPUT) {
    o = WRAP(pa_context_get_sink_info_list)(context->context,
        pulse_sink_info_cb, &user_data);
    if (o) {
      operation_wait(context, NULL, o);
      WRAP(pa_operation_unref)(o);
    }
  }

  if (type & CUBEB_DEVICE_TYPE_INPUT) {
    o = WRAP(pa_context_get_source_info_list)(context->context,
        pulse_source_info_cb, &user_data);
    if (o) {
      operation_wait(context, NULL, o);
      WRAP(pa_operation_unref)(o);
    }
  }

  WRAP(pa_threaded_mainloop_unlock)(context->mainloop);

  collection->device = user_data.devinfo;
  collection->count = user_data.count;

  free(user_data.default_sink_name);
  free(user_data.default_source_name);
  return CUBEB_OK;
}